

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O2

int ms5837_conversion_and_read_adc(MS5837 *pMS5837,uint8_t cmd,uint32_t *adc)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  uchar recvbuf [3];
  ulong uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = ms5837_write_command(pMS5837,cmd);
  iVar2 = 1;
  if (iVar1 == 0) {
    mSleep((ulong)pMS5837->conversion_time[cmd >> 1 & 7] / 1000);
    iVar1 = ms5837_write_command(pMS5837,'\0');
    if (iVar1 == 0) {
      uStack_28 = uStack_28 & 0xff000000ffffffff;
      iVar1 = ReadAllI2CBus(&pMS5837->I2CBus,recvbuf,3);
      if (iVar1 == 0) {
        if ((pMS5837->bSaveRawData != 0) && ((FILE *)pMS5837->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,3,1,(FILE *)pMS5837->pfSaveFile);
          fflush((FILE *)pMS5837->pfSaveFile);
        }
        *adc = (uint)recvbuf[2] | (uint)recvbuf[1] << 8 | (uint)recvbuf[0] << 0x10;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

inline int ms5837_conversion_and_read_adc(MS5837* pMS5837, uint8_t cmd, uint32_t *adc)
{
	unsigned char recvbuf[3];
	int recvbuflen = 0;

	if (ms5837_write_command(pMS5837, cmd) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// delay conversion depending on resolution
	mSleep(pMS5837->conversion_time[ (cmd & MS5837_CONVERSION_OSR_MASK)/2 ]/1000 );
	
	// Send the read command
	if (ms5837_write_command(pMS5837, MS5837_READ_ADC) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 3;

	if (ReadAllI2CBus(&pMS5837->I2CBus, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	*adc = ((uint32_t)recvbuf[0] << 16) | ((uint32_t)recvbuf[1] << 8) | recvbuf[2];
	
	return EXIT_SUCCESS;
}